

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

void ucnv_extGetUnicodeSet_63
               (UConverterSharedData *sharedData,USetAdder *sa,UConverterUnicodeSet which,
               UConverterSetFilter filter,UErrorCode *pErrorCode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int32_t *cx_00;
  UBool UVar6;
  uint uVar7;
  int32_t local_b0;
  uint local_ac;
  int32_t length;
  UChar32 c;
  UChar s [19];
  int32_t local_78;
  int32_t minLength;
  int32_t st3;
  int32_t st2;
  int32_t stage1Length;
  int32_t st1;
  uint32_t value;
  uint32_t *stage3b;
  uint16_t *ps3;
  uint16_t *ps2;
  uint16_t *stage3;
  uint16_t *stage12;
  int32_t *cx;
  UErrorCode *pErrorCode_local;
  UConverterSetFilter filter_local;
  UConverterUnicodeSet which_local;
  USetAdder *sa_local;
  UConverterSharedData *sharedData_local;
  
  cx_00 = (sharedData->mbcs).extIndexes;
  if (cx_00 != (int32_t *)0x0) {
    iVar1 = cx_00[10];
    iVar2 = cx_00[0xd];
    iVar3 = cx_00[0xf];
    iVar4 = cx_00[0xb];
    local_ac = 0;
    if (filter == UCNV_SET_FILTER_2022_CN) {
      local_78 = 3;
    }
    else if (((sharedData->mbcs).outputType == 0xdb) || (filter != UCNV_SET_FILTER_NONE)) {
      local_78 = 2;
    }
    else {
      local_78 = 1;
    }
    for (st2 = 0; st2 < iVar4; st2 = st2 + 1) {
      uVar7 = (uint)*(ushort *)((long)cx_00 + (long)st2 * 2 + (long)iVar1);
      if (iVar4 < (int)uVar7) {
        for (minLength = 0; minLength < 0x40; minLength = minLength + 1) {
          uVar5 = (uint)*(ushort *)
                         ((long)cx_00 + (long)minLength * 2 + (long)(int)uVar7 * 2 + (long)iVar1);
          if (uVar5 == 0) {
            local_ac = local_ac + 0x10;
          }
          else {
            stage3b = (uint32_t *)((long)cx_00 + (long)(int)(uVar5 << 2) * 2 + (long)iVar2);
            do {
              uVar5 = *(uint *)((long)cx_00 + (ulong)(ushort)*stage3b * 4 + (long)iVar3);
              if (uVar5 != 0) {
                if (uVar5 >> 0x18 == 0) {
                  if (local_ac < 0x10000) {
                    local_b0 = 1;
                    length._0_2_ = (ushort)local_ac;
                  }
                  else {
                    length._0_2_ = (short)((int)local_ac >> 10) + 0xd7c0;
                    length._2_2_ = (ushort)local_ac & 0x3ff | 0xdc00;
                    local_b0 = 2;
                  }
                  ucnv_extGetUnicodeSetString
                            (sharedData,cx_00,sa,which,local_78,local_ac,(UChar *)&length,local_b0,
                             uVar5,pErrorCode);
                }
                else {
                  UVar6 = extSetUseMapping(which,local_78,uVar5);
                  if (UVar6 != '\0') {
                    switch(filter) {
                    case UCNV_SET_FILTER_2022_CN:
                      if (((uVar5 >> 0x18 & 0x1f) == 3) && ((uVar5 & 0xffffff) < 0x830000))
                      goto switchD_004cdfc9_default;
                      break;
                    case UCNV_SET_FILTER_SJIS:
                      if ((((uVar5 >> 0x18 & 0x1f) == 2) && (0x813f < (uVar5 & 0xffffff))) &&
                         ((uVar5 & 0xffffff) < 0xeffd)) goto switchD_004cdfc9_default;
                      break;
                    case UCNV_SET_FILTER_GR94DBCS:
                      if (((uVar5 >> 0x18 & 0x1f) == 2) &&
                         (((uVar5 & 0xffffff) - 0xa1a1 & 0xffff) < 0x5d5e)) {
joined_r0x004ce094:
                        if (((uVar5 & 0xffffff) - 0xa1 & 0xff) < 0x5e)
                        goto switchD_004cdfc9_default;
                      }
                      break;
                    case UCNV_SET_FILTER_HZ:
                      if (((uVar5 >> 0x18 & 0x1f) == 2) &&
                         (((uVar5 & 0xffffff) - 0xa1a1 & 0xffff) < 0x5c5e)) goto joined_r0x004ce094;
                      break;
                    default:
switchD_004cdfc9_default:
                      (*(code *)sa->add)(sa->set,local_ac);
                    }
                  }
                }
              }
              local_ac = local_ac + 1;
              stage3b = (uint32_t *)((long)stage3b + 2);
            } while ((local_ac & 0xf) != 0);
          }
        }
      }
      else {
        local_ac = local_ac + 0x400;
      }
    }
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extGetUnicodeSet(const UConverterSharedData *sharedData,
                      const USetAdder *sa,
                      UConverterUnicodeSet which,
                      UConverterSetFilter filter,
                      UErrorCode *pErrorCode) {
    const int32_t *cx;
    const uint16_t *stage12, *stage3, *ps2, *ps3;
    const uint32_t *stage3b;

    uint32_t value;
    int32_t st1, stage1Length, st2, st3, minLength;

    UChar s[UCNV_EXT_MAX_UCHARS];
    UChar32 c;
    int32_t length;

    cx=sharedData->mbcs.extIndexes;
    if(cx==NULL) {
        return;
    }

    stage12=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_12_INDEX, uint16_t);
    stage3=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3_INDEX, uint16_t);
    stage3b=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3B_INDEX, uint32_t);

    stage1Length=cx[UCNV_EXT_FROM_U_STAGE_1_LENGTH];

    /* enumerate the from-Unicode trie table */
    c=0; /* keep track of the current code point while enumerating */

    if(filter==UCNV_SET_FILTER_2022_CN) {
        minLength=3;
    } else if( sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY ||
               filter!=UCNV_SET_FILTER_NONE
    ) {
        /* DBCS-only, ignore single-byte results */
        minLength=2;
    } else {
        minLength=1;
    }

    /*
     * the trie enumeration is almost the same as
     * in MBCSGetUnicodeSet() for MBCS_OUTPUT_1
     */
    for(st1=0; st1<stage1Length; ++st1) {
        st2=stage12[st1];
        if(st2>stage1Length) {
            ps2=stage12+st2;
            for(st2=0; st2<64; ++st2) {
                if((st3=(int32_t)ps2[st2]<<UCNV_EXT_STAGE_2_LEFT_SHIFT)!=0) {
                    /* read the stage 3 block */
                    ps3=stage3+st3;

                    do {
                        value=stage3b[*ps3++];
                        if(value==0) {
                            /* no mapping, do nothing */
                        } else if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
                            // Recurse for partial results.
                            length=0;
                            U16_APPEND_UNSAFE(s, length, c);
                            ucnv_extGetUnicodeSetString(
                                sharedData, cx, sa, which, minLength,
                                c, s, length,
                                (int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value),
                                pErrorCode);
                        } else if(extSetUseMapping(which, minLength, value)) {
                            switch(filter) {
                            case UCNV_SET_FILTER_2022_CN:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==3 && UCNV_EXT_FROM_U_GET_DATA(value)<=0x82ffff)) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_SJIS:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 && (value=UCNV_EXT_FROM_U_GET_DATA(value))>=0x8140 && value<=0xeffc)) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_GR94DBCS:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 &&
                                     (uint16_t)((value=UCNV_EXT_FROM_U_GET_DATA(value))-0xa1a1)<=(0xfefe - 0xa1a1) &&
                                     (uint8_t)(value-0xa1)<=(0xfe - 0xa1))) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_HZ:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 &&
                                     (uint16_t)((value=UCNV_EXT_FROM_U_GET_DATA(value))-0xa1a1)<=(0xfdfe - 0xa1a1) &&
                                     (uint8_t)(value-0xa1)<=(0xfe - 0xa1))) {
                                    continue;
                                }
                                break;
                            default:
                                /*
                                 * UCNV_SET_FILTER_NONE,
                                 * or UCNV_SET_FILTER_DBCS_ONLY which is handled via minLength
                                 */
                                break;
                            }
                            sa->add(sa->set, c);
                        }
                    } while((++c&0xf)!=0);
                } else {
                    c+=16; /* empty stage 3 block */
                }
            }
        } else {
            c+=1024; /* empty stage 2 block */
        }
    }
}